

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testharness.cc
# Opt level: O1

int leveldb::test::RunAllTests(void)

{
  char *pcVar1;
  char *pcVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  string name;
  uint local_60;
  allocator local_59;
  char *local_58;
  char *local_50 [2];
  char local_40 [16];
  
  local_58 = getenv("LEVELDB_TESTS");
  local_60 = 0;
  if (((anonymous_namespace)::tests != (long *)0x0) &&
     (lVar4 = *(anonymous_namespace)::tests, (anonymous_namespace)::tests[1] != lVar4)) {
    lVar3 = 0;
    local_60 = 0;
    uVar5 = 0;
    do {
      if (local_58 == (char *)0x0) {
LAB_001088d4:
        fprintf(_stderr,"==== Test %s.%s\n",*(undefined8 *)(lVar4 + lVar3),
                *(undefined8 *)(lVar4 + 8 + lVar3));
        (**(code **)(lVar4 + 0x10 + lVar3))();
        local_60 = local_60 + 1;
      }
      else {
        std::__cxx11::string::string((string *)local_50,*(char **)(lVar4 + lVar3),&local_59);
        std::__cxx11::string::push_back((char)(string *)local_50);
        std::__cxx11::string::append((char *)local_50);
        pcVar1 = local_50[0];
        pcVar2 = strstr(local_50[0],local_58);
        if (pcVar1 != local_40) {
          operator_delete(pcVar1);
        }
        if (pcVar2 != (char *)0x0) goto LAB_001088d4;
      }
      uVar5 = uVar5 + 1;
      lVar4 = *(anonymous_namespace)::tests;
      lVar3 = lVar3 + 0x18;
    } while (uVar5 < (ulong)(((anonymous_namespace)::tests[1] - lVar4 >> 3) * -0x5555555555555555));
  }
  fprintf(_stderr,"==== PASSED %d tests\n",(ulong)local_60);
  return 0;
}

Assistant:

int RunAllTests() {
  const char* matcher = getenv("LEVELDB_TESTS");

  int num = 0;
  if (tests != nullptr) {
    for (size_t i = 0; i < tests->size(); i++) {
      const Test& t = (*tests)[i];
      if (matcher != nullptr) {
        std::string name = t.base;
        name.push_back('.');
        name.append(t.name);
        if (strstr(name.c_str(), matcher) == nullptr) {
          continue;
        }
      }
      fprintf(stderr, "==== Test %s.%s\n", t.base, t.name);
      (*t.func)();
      ++num;
    }
  }
  fprintf(stderr, "==== PASSED %d tests\n", num);
  return 0;
}